

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-queue.c
# Opt level: O1

priority_queue * qp_new(size_t size)

{
  priority_queue *ppVar1;
  priority_queue_element *ppVar2;
  
  if (size >> 0x3c == 0) {
    ppVar1 = (priority_queue *)mem_alloc(0x18);
    ppVar2 = (priority_queue_element *)mem_alloc(size << 4);
    ppVar1->data = ppVar2;
    ppVar1->size = size;
    ppVar1->count = 0;
  }
  else {
    ppVar1 = (priority_queue *)0x0;
  }
  return ppVar1;
}

Assistant:

struct priority_queue *qp_new(size_t size)
{
	struct priority_queue *result;

	if (size > SIZE_MAX / MAX(2, sizeof(struct priority_queue_element))) {
		return NULL;
	}
	result = mem_alloc(sizeof(*result));
	result->data = mem_alloc(size * sizeof(*result->data));
	result->size = size;
	result->count = 0;
	return result;
}